

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  buddy_allocator *pbVar3;
  ostream *poVar4;
  void *pvVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppvVar8;
  exception *e;
  int i_4;
  size_t i_3;
  size_t exp;
  void *tmp;
  vector<void_*,_std::allocator<void_*>_> ptrs;
  size_t i_2;
  int dir;
  size_t i_1;
  size_t j;
  char *s;
  char c;
  size_t size;
  size_t pos;
  int i;
  int limit;
  int fail;
  buddy_allocator *buddy;
  void *ptr;
  size_t memory_size;
  buddy_allocator *in_stack_000005b0;
  size_t in_stack_000009c0;
  void **in_stack_000009c8;
  buddy_allocator *in_stack_000009d0;
  value_type *in_stack_fffffffffffffe58;
  buddy_allocator *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe78;
  buddy_allocator *in_stack_fffffffffffffe80;
  int local_bc;
  ulong local_b8;
  int local_ac;
  vector<void_*,_std::allocator<void_*>_> local_98;
  ulong local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  void *local_60;
  char local_51;
  ulong local_50;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_28;
  int local_24;
  buddy_allocator *local_20;
  buddy_allocator *local_18;
  ulong local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0xa00000;
  pbVar3 = (buddy_allocator *)malloc(0xa00000);
  local_18 = pbVar3;
  cppcms::impl::buddy_allocator::buddy_allocator
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_24 = 0;
  local_28 = 1000;
  local_20 = pbVar3;
  cppcms::impl::buddy_allocator::test_free(in_stack_000005b0);
  for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
    if ((local_38 * 100) % local_28 == 0) {
      local_3c = (int)std::setw(5);
      poVar4 = std::operator<<((ostream *)&std::cout,(_Setw)local_3c);
      poVar4 = (ostream *)
               std::ostream::operator<<(poVar4,((double)local_38 * 100.0) / (double)local_28);
      poVar4 = std::operator<<(poVar4,"%");
      poVar4 = std::operator<<(poVar4,"\b\b\b\b\b\b");
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    }
    iVar2 = rand();
    local_48 = (ulong)(long)iVar2 % 100;
    iVar2 = rand();
    local_50 = (ulong)(1 << ((byte)((long)iVar2 % 0x16) & 0x1f));
    iVar2 = rand();
    local_50 = (ulong)(long)iVar2 % local_50 + local_50;
    if (memory[local_48] != (void *)0x0) {
      cppcms::impl::buddy_allocator::free(local_20,memory[local_48]);
      memory[local_48] = (void *)0x0;
      check_all();
    }
    pvVar5 = cppcms::impl::buddy_allocator::malloc(local_20,local_50);
    memory[local_48] = pvVar5;
    if (pvVar5 == (void *)0x0) {
      check_all();
      local_24 = local_24 + 1;
    }
    else {
      sizes[local_48] = local_50;
      iVar2 = rand();
      local_51 = (char)iVar2;
      vals[local_48] = local_51;
      local_60 = memory[local_48];
      for (local_68 = 0; local_68 < local_50; local_68 = local_68 + 1) {
        *(char *)((long)local_60 + local_68) = local_51;
      }
      check_all();
    }
    cppcms::impl::buddy_allocator::test_consistent
              (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0);
  }
  for (local_70 = 0; local_70 < 100; local_70 = local_70 + 1) {
    if (memory[local_70] != (void *)0x0) {
      cppcms::impl::buddy_allocator::free(local_20,memory[local_70]);
      memory[local_70] = (void *)0x0;
      check_all();
    }
    cppcms::impl::buddy_allocator::test_consistent
              (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0);
  }
  cppcms::impl::buddy_allocator::test_free(in_stack_000005b0);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n malloc fail to all ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,((double)local_24 / (double)local_28) * 100.0)
  ;
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_74 = 0;
  do {
    if (1 < local_74) {
      free(local_18);
      std::operator<<((ostream *)&std::cout,"Ok\n");
      return local_4;
    }
    for (local_80 = 1; local_80 < local_10; local_80 = local_80 << 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Object size ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_80);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::vector<void_*,_std::allocator<void_*>_>::vector
                ((vector<void_*,_std::allocator<void_*>_> *)0x107b45);
      uVar6 = local_10 / local_80;
      while (pvVar5 = cppcms::impl::buddy_allocator::malloc(local_20,local_80),
            pvVar5 != (void *)0x0) {
        std::vector<void_*,_std::allocator<void_*>_>::push_back
                  ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58);
        sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
        if ((sVar7 * 100) % uVar6 == 0) {
          std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_98,0);
          std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
          cppcms::impl::buddy_allocator::test_consistent
                    (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0);
        }
      }
      bVar1 = std::vector<void_*,_std::allocator<void_*>_>::empty
                        ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe60);
      if (bVar1) {
        local_ac = 0xe;
      }
      else {
        std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_98,0);
        std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
        cppcms::impl::buddy_allocator::test_consistent
                  (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0);
        if (local_74 == 0) {
          for (local_b8 = 0; sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&local_98),
              pbVar3 = local_20, local_b8 < sVar7; local_b8 = local_b8 + 1) {
            ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_98,local_b8);
            cppcms::impl::buddy_allocator::free(pbVar3,*ppvVar8);
            ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_98,local_b8);
            *ppvVar8 = (value_type)0x0;
            uVar6 = local_b8 * 100;
            sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
            if (uVar6 % sVar7 == 0) {
              std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_98,0);
              std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
              cppcms::impl::buddy_allocator::test_consistent
                        (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0);
            }
          }
        }
        else {
          sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
          local_bc = (int)sVar7;
          while (local_bc = local_bc + -1, -1 < local_bc) {
            in_stack_fffffffffffffe60 = local_20;
            ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                                (&local_98,(long)local_bc);
            cppcms::impl::buddy_allocator::free(in_stack_fffffffffffffe60,*ppvVar8);
            ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                                (&local_98,(long)local_bc);
            *ppvVar8 = (value_type)0x0;
            in_stack_fffffffffffffe58 = (value_type *)(long)(local_bc * 100);
            sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&local_98);
            if ((ulong)in_stack_fffffffffffffe58 % sVar7 == 0) {
              std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_98,0);
              cppcms::impl::buddy_allocator::test_consistent
                        (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0);
            }
          }
        }
        cppcms::impl::buddy_allocator::test_free(in_stack_000005b0);
        local_ac = 0;
      }
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe60);
      if (local_ac != 0) break;
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

int main()
{
	size_t memory_size = 1024*1024*10ULL;
	void *ptr = malloc(memory_size);
	cppcms::impl::buddy_allocator *buddy=new(ptr) cppcms::impl::buddy_allocator(memory_size);
	try{
		int fail = 0;

		int limit = 1000;

		buddy->test_free();
		for(int i=0;i<limit;i++) {
			if(i*100 % limit==0)
				std::cout << std::setw(5) << i*100.0 / limit << "%"<< "\b\b\b\b\b\b" << std::flush;
			size_t pos = rand() % objects;
			size_t size = (1 << (rand() % 22));
			size += rand() % size;
			if(memory[pos]) {
				buddy->free(memory[pos]);
				memory[pos] = 0;
				check_all();
			}
			if((memory[pos]=buddy->malloc(size))==0) {
				check_all();
				fail++;
			}
			else {
				sizes[pos] = size;
				char c=rand();
				vals[pos] = c;
				char *s = static_cast<char *>(memory[pos]);
				for(size_t j=0;j<size;j++)
					s[j] = c;
				check_all();
			}
			buddy->test_consistent(memory,objects);
		}
		for(size_t i=0;i<objects;i++) {
			if(memory[i]) {
				buddy->free(memory[i]);
				memory[i]=0;
				check_all();
			}
			buddy->test_consistent(memory,objects);
		}

		buddy->test_free();
		std::cout << "\n malloc fail to all " << double(fail) / limit * 100 << std::endl;
		for(int dir=0;dir<=1;dir++) {
			for(size_t i=1;i<memory_size;i*=2) {
				std::cout << "Object size " << i << std::endl;
				std::vector<void *> ptrs;
				void *tmp=0;
				size_t exp =  memory_size / i;
				while((tmp=buddy->malloc(i))!=0) {
					ptrs.push_back(tmp);
					if(ptrs.size() * 100 % exp==0)
						buddy->test_consistent(&ptrs[0],ptrs.size());
				}
				if(ptrs.empty())
					break;
				buddy->test_consistent(&ptrs[0],ptrs.size());
				if(dir == 0) {
					for(size_t i=0;i<ptrs.size();i++) {
						buddy->free(ptrs[i]);
						ptrs[i]=0;
						if(i*100 % ptrs.size() == 0)
							buddy->test_consistent(&ptrs[0]+i,ptrs.size()-i);
					}
				}
				else {
					for(int i=ptrs.size()-1;i>=0;i--) {
						buddy->free(ptrs[i]);
						ptrs[i]=0;
						if(i*100 % ptrs.size() == 0)
							buddy->test_consistent(&ptrs[0],i);
					}
				}
				buddy->test_free();
			}
		}

	}
	catch(std::exception const &e) {
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	buddy->~buddy_allocator();
	free(ptr);
	std::cout << "Ok\n";
}